

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_secure744.c
# Opt level: O0

void test_write_disk_secure744(void)

{
  int iVar1;
  wchar_t wVar2;
  char *name;
  archive *_a;
  char *pcVar3;
  archive_entry *paVar4;
  size_t sVar5;
  uint local_34;
  int t;
  int n;
  char *p;
  char *buff;
  size_t buff_size;
  archive_entry *ae;
  archive *a;
  
  name = (char *)malloc(0x2000);
  local_34 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                   ,L'/',(uint)(name != (char *)0x0),"buff != NULL",(void *)0x0);
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                  ,L'2',L'\x12');
  _a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                   ,L'5',(uint)(_a != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  archive_write_disk_set_options(_a,L'Ā');
  _t = name;
  do {
    if (name + 0x2000 <= _t + 500) break;
    memset(_t,0x78,100);
    pcVar3 = _t + 100;
    *pcVar3 = '\0';
    *name = (char)((long)((ulong)(uint)((int)((long)(int)local_34 / 1000) >> 0x1f) << 0x20 |
                         (long)(int)local_34 / 1000 & 0xffffffffU) % 10) + '0';
    name[1] = (char)((long)((ulong)(uint)((int)((long)(int)local_34 / 100) >> 0x1f) << 0x20 |
                           (long)(int)local_34 / 100 & 0xffffffffU) % 10) + '0';
    name[2] = (char)((long)((ulong)(uint)((int)((long)(int)local_34 / 10) >> 0x1f) << 0x20 |
                           (long)(int)local_34 / 10 & 0xffffffffU) % 10) + '0';
    name[3] = (char)((long)((ulong)(uint)((int)((long)(int)local_34 / 1) >> 0x1f) << 0x20 |
                           (long)(int)local_34 / 1 & 0xffffffffU) % 10) + '0';
    name[4] = '_';
    local_34 = local_34 + 1;
    paVar4 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                     ,L'E',(uint)(paVar4 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar4,name);
    archive_entry_set_mode(paVar4,0x81ff);
    archive_entry_copy_symlink(paVar4,testworkdir);
    iVar1 = archive_write_header(_a,paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                        ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",_a);
    archive_entry_free(paVar4);
    _t = _t + 0x65;
    *pcVar3 = '/';
    snprintf(_t,0x2000 - ((long)_t - (long)name),"target%d",(ulong)local_34);
    paVar4 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                     ,L'P',(uint)(paVar4 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar4,name);
    archive_entry_set_mode(paVar4,0x41ff);
    iVar1 = archive_write_header(_a,paVar4);
    archive_entry_free(paVar4);
    sVar5 = strlen(name);
    failure("Attempt to create target%d via %d-character symlink should have failed",(ulong)local_34
            ,sVar5 & 0xffffffff);
    wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure744.c"
                                ,L'W',-0x19,"ARCHIVE_FAILED",(long)iVar1,"t",(void *)0x0);
  } while (wVar2 != L'\0');
  archive_free(_a);
  free(name);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_secure744)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("archive_write_disk security checks not supported on Windows");
#else
	struct archive *a;
	struct archive_entry *ae;
	size_t buff_size = 8192;
	char *buff = malloc(buff_size);
	char *p = buff;
	int n = 0;
	int t;

	assert(buff != NULL);

	/* Start with a known umask. */
	assertUmask(UMASK);

	/* Create an archive_write_disk object. */
	assert((a = archive_write_disk_new()) != NULL);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_SYMLINKS);

	while (p + 500 < buff + buff_size) {
		memset(p, 'x', 100);
		p += 100;
		p[0] = '\0';

		buff[0] = ((n / 1000) % 10) + '0';
		buff[1] = ((n / 100) % 10)+ '0';
		buff[2] = ((n / 10) % 10)+ '0';
		buff[3] = ((n / 1) % 10)+ '0';
		buff[4] = '_';
		++n;

		/* Create a symlink pointing to the testworkdir */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, buff);
		archive_entry_set_mode(ae, S_IFREG | 0777);
		archive_entry_copy_symlink(ae, testworkdir);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		archive_entry_free(ae);

		*p++ = '/';
		snprintf(p, buff_size - (p - buff), "target%d", n);

		/* Try to create a file through the symlink, should fail. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, buff);
		archive_entry_set_mode(ae, S_IFDIR | 0777);

		t = archive_write_header(a, ae);
		archive_entry_free(ae);
		failure("Attempt to create target%d via %d-character symlink should have failed", n, (int)strlen(buff));
		if(!assertEqualInt(ARCHIVE_FAILED, t)) {
			break;
		}
	}
	archive_free(a);
	free(buff);
#endif
}